

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall
mjs::parser::parse_expression1(parser *this,expression_ptr *lhs,int outer_precedence)

{
  token_type t;
  expression *peVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  wostream *pwVar6;
  int in_ECX;
  undefined4 in_register_00000014;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_1;
  wstring_view *s;
  element_type *peVar7;
  wchar_t *in_R9;
  wstring_view message;
  anon_class_1_1_a85bef83 prec;
  token_type op;
  undefined1 local_248 [48];
  undefined1 local_218 [32];
  wostringstream _oss;
  token local_80;
  token local_58;
  
  args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
           CONCAT44(in_register_00000014,outer_precedence);
  prec.no_in = (bool)(*(int *)&lhs[2]._M_t.
                               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                               .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl < 1 |
                     *(byte *)((long)&lhs[0xf]._M_t.
                                      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                      .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl
                              + 1));
  local_248._36_4_ = in_ECX;
  local_248._40_8_ = args_1;
  local_218._24_8_ = this;
  do {
    op = *(token_type *)
          &lhs[0x10]._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    iVar4 = parse_expression1::anon_class_1_1_a85bef83::operator()(&prec,op);
    if ((int)local_248._36_4_ < iVar4) {
      *(expression **)local_218._24_8_ =
           (args_1->_M_t).
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
      return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             local_218._24_8_;
    }
    get_token(&local_58,(parser *)lhs);
    token::destroy(&local_58);
    if (op == question) {
      parse_assignment_expression((parser *)&_oss);
      expect(&local_80,(parser *)lhs,colon,"parse_expression1",0x259);
      token::destroy(&local_80);
      parse_assignment_expression((parser *)local_218);
      make_expression<mjs::conditional_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_248,lhs,args_1,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&_oss);
      uVar2 = local_248._0_8_;
      local_248._0_8_ = (element_type *)0x0;
      peVar1 = (args_1->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)uVar2;
      if (peVar1 != (expression *)0x0) {
        (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 8))();
        if ((element_type *)local_248._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_248._0_8_ + 8))();
        }
      }
      local_248._0_8_ = (element_type *)0x0;
      peVar7 = (element_type *)local_218._0_8_;
LAB_0016ac03:
      if (peVar7 != (element_type *)0x0) {
        (**(code **)(*(long *)peVar7 + 8))();
      }
    }
    else {
      if (*(char *)&lhs[0xc]._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == '\x01') {
        bVar3 = is_assignment_op(op);
        if (bVar3) {
          bVar3 = is_strict_mode_unassignable_identifier
                            ((args_1->_M_t).
                             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                             .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
          if (bVar3) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
            pwVar6 = std::operator<<((wostream *)&_oss,"\"");
            peVar1 = (((__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                        *)local_248._40_8_)->
                     super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>).
                     _M_t.
                     super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                     .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
            local_218._8_8_ = peVar1[1].super_syntax_node._vptr_syntax_node;
            local_218._0_8_ =
                 peVar1[1].super_syntax_node.extend_.file.
                 super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            cpp_quote_abi_cxx11_((wstring *)local_248,(mjs *)local_218,s);
            pwVar6 = std::operator<<(pwVar6,(wstring *)local_248);
            std::operator<<(pwVar6,"\" may not be assigned in strict mode");
            std::__cxx11::wstring::~wstring((wstring *)local_248);
            current_extend((source_extend *)local_218,(parser *)lhs);
            std::__cxx11::wstringbuf::str();
            message._M_str = in_R9;
            message._M_len = local_248._0_8_;
            syntax_error((parser *)"parse_expression1",(char *)0x25e,(int)local_218,
                         (source_extend *)local_248._8_8_,message);
          }
        }
      }
      parse_unary_expression((parser *)&_oss);
      while( true ) {
        t = *(token_type *)
             &lhs[0x10]._M_t.
              super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
              super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
              super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
        iVar5 = parse_expression1::anon_class_1_1_a85bef83::operator()(&prec,t);
        if (iVar4 < iVar5) break;
        if (iVar5 == iVar4) {
          bVar3 = is_right_to_left(t);
          if (!bVar3) break;
        }
        parse_expression1((parser *)local_248,lhs,(int)(parser *)&_oss);
        uVar2 = __oss;
        __oss = local_248._0_8_;
        local_248._0_8_ = (element_type *)0x0;
        if ((element_type *)uVar2 != (element_type *)0x0) {
          (**(code **)(*(long *)uVar2 + 8))();
          if ((element_type *)local_248._0_8_ != (element_type *)0x0) {
            (**(code **)(*(long *)local_248._0_8_ + 8))();
          }
        }
      }
      args_1 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               local_248._40_8_;
      make_expression<mjs::binary_expression,mjs::token_type_const&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_248,(token_type *)lhs,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&op,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 local_248._40_8_);
      uVar2 = local_248._0_8_;
      local_248._0_8_ = (element_type *)0x0;
      peVar1 = (args_1->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (args_1->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)uVar2;
      if (peVar1 != (expression *)0x0) {
        (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 8))();
        peVar7 = (element_type *)local_248._0_8_;
        goto LAB_0016ac03;
      }
    }
    if ((element_type *)__oss != (element_type *)0x0) {
      (**(code **)(*(long *)__oss + 8))();
    }
  } while( true );
}

Assistant:

expression_ptr parse_expression1(expression_ptr&& lhs, int outer_precedence) {
        auto prec = [no_in=supress_in_ || version_ < version::es3](token_type t) { return !no_in || t != token_type::in_ ? operator_precedence(t) : 100; };

        for (;;) {
            const auto op = current_token_type();
            const auto precedence = prec(op);
            if (precedence > outer_precedence) {
                break;
            }
            get_token();
            if (op == token_type::question) {
                auto l = parse_assignment_expression();
                EXPECT(token_type::colon);
                lhs = make_expression<conditional_expression>(std::move(lhs), std::move(l), parse_assignment_expression());
                continue;
            }
            if (strict_mode_ && is_assignment_op(op) && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be assigned in strict mode");
            }

            auto rhs = parse_unary_expression();
            for (;;) {
                const auto look_ahead = current_token_type();
                const auto look_ahead_precedence = prec(look_ahead);
                if (look_ahead_precedence > precedence || (look_ahead_precedence == precedence && !is_right_to_left(look_ahead))) {
                    break;
                }
                rhs = parse_expression1(std::move(rhs), look_ahead_precedence);
            }

            lhs = make_expression<binary_expression>(op, std::move(lhs), std::move(rhs));
        }
        return std::move(lhs);
    }